

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode __thiscall JSONNode::as_node(JSONNode *this)

{
  internalJSONNode *piVar1;
  uchar uVar2;
  JSONNode *in_RSI;
  allocator local_39;
  json_string local_38;
  JSONNode *this_local;
  JSONNode *res;
  
  piVar1 = in_RSI->internal;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar2 = type(in_RSI);
  if (uVar2 == '\x05') {
    JSONNode(this,in_RSI);
  }
  else {
    uVar2 = type(in_RSI);
    if (uVar2 == '\x04') {
      duplicate(this);
      this->internal->_type = '\x05';
    }
    else {
      JSONNode(this,'\x05');
    }
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::as_node(void) const json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (type() == JSON_NODE){
		  return *this;
	   } else if (type() == JSON_ARRAY){
		  JSONNode res(duplicate());
		  res.internal -> _type = JSON_NODE;
		  return res;
	   }
	   #ifdef JSON_MUTEX_CALLBACKS
		  if (internal -> mylock != 0){
			 JSONNode res(JSON_NODE);
			 res.set_mutex(internal -> mylock);
			 return res;
		  }
	   #endif
	   return JSONNode(JSON_NODE);
    }